

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_get_person_name(void)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  socklen_t in_ECX;
  bool bVar4;
  exception *e;
  type result;
  bool r;
  rpc_client client;
  person *in_stack_fffffffffffffb18;
  string *in_stack_fffffffffffffb20;
  rpc_client *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb50;
  allocator local_491;
  undefined4 local_490;
  unsigned_short in_stack_fffffffffffffb76;
  string *in_stack_fffffffffffffb78;
  rpc_client *in_stack_fffffffffffffb80;
  allocator local_459;
  string local_458 [32];
  string local_438 [36];
  uint local_414;
  byte local_40d;
  allocator local_3f9;
  string local_3f8 [32];
  rpc_client local_3d8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"127.0.0.1",&local_3f9);
  rest_rpc::rpc_client::rpc_client
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,in_stack_fffffffffffffb76);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  uVar2 = rest_rpc::rpc_client::connect(&local_3d8,3,(sockaddr *)0x0,in_ECX);
  bVar1 = (byte)uVar2;
  local_40d = bVar1 & 1;
  bVar4 = (uVar2 & 1) != 0;
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458,"get_person_name",&local_459);
    local_490 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffb78,"tom",&local_491);
    rest_rpc::rpc_client::call<std::__cxx11::string,person>
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    person::~person((person *)0x1aca8d);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::__cxx11::string::~string(local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    poVar3 = std::operator<<((ostream *)&std::cout,local_438);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_438);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"connect timeout");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  local_414 = (uint)!bVar4;
  rest_rpc::rpc_client::~rpc_client((rpc_client *)CONCAT17(bVar1,in_stack_fffffffffffffb50));
  return;
}

Assistant:

void test_get_person_name() {
  try {
    rpc_client client("127.0.0.1", 9000);
    bool r = client.connect();
    if (!r) {
      std::cout << "connect timeout" << std::endl;
      return;
    }

    auto result =
        client.call<std::string>("get_person_name", person{1, "tom", 20});
    std::cout << result << std::endl;
  } catch (const std::exception &e) {
    std::cout << e.what() << std::endl;
  }
}